

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlACatalogAdd(xmlCatalogPtr catal,xmlChar *type,xmlChar *orig,xmlChar *replace)

{
  _xmlCatalogEntry **pp_Var1;
  xmlCatalogEntryType xVar2;
  _xmlCatalogEntry *p_Var3;
  int iVar4;
  xmlCatalogEntryPtr pxVar5;
  xmlHashTablePtr hash;
  xmlCatalogEntryPtr pxVar6;
  void *pvVar7;
  xmlChar *pxVar8;
  _xmlCatalogEntry *p_Var9;
  bool bVar10;
  
  iVar4 = -1;
  if (catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar5 = catal->xml;
      if ((pxVar5 != (xmlCatalogEntryPtr)0x0) && ((uint)(pxVar5->type + XML_CATA_REMOVED) < 2)) {
        if (pxVar5->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(pxVar5);
          bVar10 = pxVar5->children == (_xmlCatalogEntry *)0x0;
        }
        else {
          bVar10 = false;
        }
        iVar4 = xmlStrEqual(type,"system");
        if (iVar4 == 0) {
          iVar4 = xmlStrEqual(type,(xmlChar *)"public");
          if (iVar4 == 0) {
            iVar4 = xmlStrEqual(type,(xmlChar *)"rewriteSystem");
            if (iVar4 == 0) {
              iVar4 = xmlStrEqual(type,(xmlChar *)"delegatePublic");
              if (iVar4 == 0) {
                iVar4 = xmlStrEqual(type,(xmlChar *)"delegateSystem");
                if (iVar4 == 0) {
                  iVar4 = xmlStrEqual(type,"uri");
                  if (iVar4 == 0) {
                    iVar4 = xmlStrEqual(type,(xmlChar *)"rewriteURI");
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(type,(xmlChar *)"delegateURI");
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual(type,(xmlChar *)"nextCatalog");
                        if (iVar4 == 0) {
                          iVar4 = xmlStrEqual(type,"catalog");
                          if (iVar4 == 0) {
                            if (xmlDebugCatalogs == 0) {
                              return -1;
                            }
                            xmlCatalogPrintDebug
                                      ("Failed to add unknown element %s to catalog\n",type);
                            return -1;
                          }
                          xVar2 = XML_CATA_CATALOG;
                        }
                        else {
                          xVar2 = XML_CATA_NEXT_CATALOG;
                        }
                      }
                      else {
                        xVar2 = XML_CATA_DELEGATE_URI;
                      }
                    }
                    else {
                      xVar2 = XML_CATA_REWRITE_URI;
                    }
                  }
                  else {
                    xVar2 = XML_CATA_URI;
                  }
                }
                else {
                  xVar2 = XML_CATA_DELEGATE_SYSTEM;
                }
              }
              else {
                xVar2 = XML_CATA_DELEGATE_PUBLIC;
              }
            }
            else {
              xVar2 = XML_CATA_REWRITE_SYSTEM;
            }
          }
          else {
            xVar2 = XML_CATA_PUBLIC;
          }
        }
        else {
          xVar2 = XML_CATA_SYSTEM;
        }
        pp_Var1 = &pxVar5->children;
        p_Var3 = *pp_Var1;
        if (*pp_Var1 == (_xmlCatalogEntry *)0x0) {
          p_Var9 = (_xmlCatalogEntry *)0x0;
        }
        else {
          do {
            p_Var9 = p_Var3;
            if (((orig != (xmlChar *)0x0) && (p_Var9->type == xVar2)) &&
               (iVar4 = xmlStrEqual(orig,p_Var9->name), iVar4 != 0)) {
              if (xmlDebugCatalogs != 0) {
                xmlCatalogPrintDebug("Updating element %s to catalog\n",type);
              }
              if (p_Var9->value != (xmlChar *)0x0) {
                (*xmlFree)(p_Var9->value);
              }
              if (p_Var9->URL != (xmlChar *)0x0) {
                (*xmlFree)(p_Var9->URL);
              }
              pxVar8 = xmlStrdup(replace);
              p_Var9->value = pxVar8;
              pxVar8 = xmlStrdup(replace);
              p_Var9->URL = pxVar8;
              return 0;
            }
            p_Var3 = p_Var9->next;
          } while (p_Var9->next != (_xmlCatalogEntry *)0x0);
        }
        if (xmlDebugCatalogs != 0) {
          xmlCatalogPrintDebug("Adding element %s to catalog\n",type);
        }
        iVar4 = 0;
        pxVar6 = xmlNewCatalogEntry(xVar2,orig,replace,(xmlChar *)0x0,pxVar5->prefer,
                                    (xmlCatalogEntryPtr)0x0);
        if (p_Var9 == (_xmlCatalogEntry *)0x0) {
          p_Var9 = (_xmlCatalogEntry *)pp_Var1;
        }
        p_Var9->next = pxVar6;
        if (bVar10) {
          pxVar5->type = XML_CATA_CATALOG;
          pvVar7 = xmlHashLookup(xmlCatalogXMLFiles,pxVar5->URL);
          if (pvVar7 != (void *)0x0) {
            *(_xmlCatalogEntry **)((long)pvVar7 + 0x10) = *pp_Var1;
          }
        }
      }
    }
    else {
      iVar4 = xmlStrEqual(type,"SYSTEM");
      if (iVar4 == 0) {
        iVar4 = xmlStrEqual(type,(xmlChar *)"PUBLIC");
        if (iVar4 == 0) {
          iVar4 = xmlStrEqual(type,(xmlChar *)"DELEGATE");
          if (iVar4 == 0) {
            iVar4 = xmlStrEqual(type,"ENTITY");
            if (iVar4 == 0) {
              iVar4 = xmlStrEqual(type,(xmlChar *)"DOCTYPE");
              if (iVar4 == 0) {
                iVar4 = xmlStrEqual(type,(xmlChar *)"LINKTYPE");
                if (iVar4 == 0) {
                  iVar4 = xmlStrEqual(type,(xmlChar *)"NOTATION");
                  if (iVar4 == 0) {
                    iVar4 = xmlStrEqual(type,(xmlChar *)"SGMLDECL");
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(type,(xmlChar *)"DOCUMENT");
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual(type,"CATALOG");
                        if (iVar4 == 0) {
                          iVar4 = xmlStrEqual(type,(xmlChar *)"BASE");
                          if (iVar4 == 0) {
                            return -1;
                          }
                          xVar2 = SGML_CATA_BASE;
                        }
                        else {
                          xVar2 = SGML_CATA_CATALOG;
                        }
                      }
                      else {
                        xVar2 = SGML_CATA_DOCUMENT;
                      }
                    }
                    else {
                      xVar2 = SGML_CATA_SGMLDECL;
                    }
                  }
                  else {
                    xVar2 = SGML_CATA_NOTATION;
                  }
                }
                else {
                  xVar2 = SGML_CATA_LINKTYPE;
                }
              }
              else {
                xVar2 = SGML_CATA_DOCTYPE;
              }
            }
            else {
              xVar2 = SGML_CATA_ENTITY;
            }
          }
          else {
            xVar2 = SGML_CATA_DELEGATE;
          }
        }
        else {
          xVar2 = SGML_CATA_PUBLIC;
        }
      }
      else {
        xVar2 = SGML_CATA_SYSTEM;
      }
      pxVar5 = xmlNewCatalogEntry(xVar2,orig,replace,(xmlChar *)0x0,XML_CATA_PREFER_NONE,
                                  (xmlCatalogEntryPtr)0x0);
      hash = catal->sgml;
      if (hash == (xmlHashTablePtr)0x0) {
        hash = xmlHashCreate(10);
        catal->sgml = hash;
      }
      iVar4 = xmlHashAddEntry(hash,orig,pxVar5);
      if (iVar4 < 0) {
        xmlFreeCatalogEntry(pxVar5,orig);
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlACatalogAdd(xmlCatalogPtr catal, const xmlChar * type,
              const xmlChar * orig, const xmlChar * replace)
{
    int res = -1;

    if (catal == NULL)
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
        res = xmlAddXMLCatalog(catal->xml, type, orig, replace);
    } else {
        xmlCatalogEntryType cattype;

        cattype = xmlGetSGMLCatalogEntryType(type);
        if (cattype != XML_CATA_NONE) {
            xmlCatalogEntryPtr entry;

            entry = xmlNewCatalogEntry(cattype, orig, replace, NULL,
                                       XML_CATA_PREFER_NONE, NULL);
	    if (catal->sgml == NULL)
		catal->sgml = xmlHashCreate(10);
            res = xmlHashAddEntry(catal->sgml, orig, entry);
            if (res < 0)
                xmlFreeCatalogEntry(entry, NULL);
        }
    }
    return (res);
}